

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O2

t_pvalue __thiscall xemmai::t_directory::f_read(t_directory *this,t_os *a_library)

{
  t_type_of<xemmai::t_object> *ptVar1;
  t_type *a_type;
  path *ppVar2;
  undefined8 uVar3;
  t_queue<128UL> *ptVar4;
  t_os *in_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_00;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar5;
  undefined1 *this_00;
  t_pvalue tVar6;
  t_object *local_a0;
  wstring local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [4];
  
  t_owned::f_owned_or_throw((t_owned *)a_library);
  local_68._16_8_ = (__pointer_type)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ptVar1 = (a_library->v_type_path).v_p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_50);
  if (ptVar1 == (t_type_of<xemmai::t_object> *)0x0) {
    ptVar4 = (t_queue<128UL> *)0x0;
    aVar5 = extraout_RDX;
  }
  else {
    this_00 = &a_library->field_0x8;
    ppVar2 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                               ((directory_iterator *)this_00);
    uVar3 = std::filesystem::status(ppVar2);
    a_type = (in_RDX->v_type_directory_entry).v_p;
    ppVar2 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                               ((directory_iterator *)this_00);
    std::filesystem::__cxx11::path::filename((path *)(local_68 + 0x10),ppVar2);
    std::filesystem::__cxx11::path::wstring(&local_98,(path *)(local_68 + 0x10));
    local_a0 = (t_object *)
               xemmai::t_string::f_instantiate(local_98._M_dataplus._M_p,local_98._M_string_length);
    t_enum_of<std::filesystem::file_type,_xemmai::t_os>::f_transfer
              ((t_enum_of<std::filesystem::file_type,_xemmai::t_os> *)local_68,in_RDX,
               (file_type)uVar3);
    t_enum_of<std::filesystem::perms,_xemmai::t_os>::f_transfer
              ((t_enum_of<std::filesystem::perms,_xemmai::t_os> *)local_78,in_RDX,
               (perms)((ulong)uVar3 >> 0x20));
    ptVar4 = (t_queue<128UL> *)
             f_new_value<xemmai::t_object*,xemmai::t_value<xemmai::t_pointer>,xemmai::t_value<xemmai::t_pointer>>
                       (a_type,&local_a0,(t_value<xemmai::t_pointer> *)local_68,
                        (t_value<xemmai::t_pointer> *)local_78);
    std::__cxx11::wstring::~wstring((wstring *)&local_98);
    std::filesystem::__cxx11::path::~path((path *)(local_68 + 0x10));
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)this_00);
    aVar5 = extraout_RDX_00;
  }
  (this->super_t_owned).v_owner = ptVar4;
  tVar6.field_0.v_integer = aVar5.v_integer;
  tVar6.super_t_pointer.v_p = (t_object *)this;
  return tVar6;
}

Assistant:

t_pvalue t_directory::f_read(t_os* a_library)
{
	f_owned_or_throw();
	if (v_i == decltype(v_i){}) return nullptr;
	auto status = v_i->status();
	auto p = f_new_value(a_library->v_type_directory_entry, t_string::f_instantiate(v_i->path().filename().wstring()), a_library->f_as(status.type()), a_library->f_as(status.permissions()));
	++v_i;
	return p;
}